

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O1

void print_binary_diff(FILE *stream,void *data1v,size_t size1,void *data2v,size_t size2,
                      bool use_color,size_t context_lines,uint64_t base_offset)

{
  uint8_t *data;
  ulong uVar1;
  long lVar2;
  uint uVar3;
  size_t z;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  size_t line_index;
  long lVar7;
  uint16_t diff_flags;
  uint uVar8;
  anon_class_32_4_ace858be print_diff_line;
  bool local_9d;
  int local_9c;
  size_t local_98;
  uint8_t *local_90;
  void *local_88;
  FILE *local_80;
  uint8_t *local_78;
  ulong local_70;
  size_t local_68;
  size_t local_60;
  void *local_58;
  anon_class_32_4_ace858be local_50;
  
  sVar4 = size2;
  if (size2 < size1) {
    sVar4 = size1;
  }
  uVar1 = base_offset + sVar4;
  if (uVar1 < 0x100000001) {
    if (uVar1 < 0x10001) {
      if (uVar1 < 0x101) {
        local_9c = 2;
      }
      else {
        local_9c = 4;
      }
    }
    else {
      local_9c = 8;
    }
  }
  else {
    local_9c = 0x10;
  }
  local_50.use_color = &local_9d;
  local_50.stream = (FILE **)&local_80;
  local_50.base_offset = &base_offset;
  local_50.offset_width_digits = &local_9c;
  local_70 = sVar4 + 0xf >> 4;
  local_9d = use_color;
  local_80 = (FILE *)stream;
  local_78 = (uint8_t *)data2v;
  if (sVar4 + 0xf < 0x10) {
    uVar1 = 0;
  }
  else {
    local_60 = local_70 + (local_70 == 0);
    sVar4 = ~context_lines;
    lVar7 = 0;
    uVar1 = 0;
    line_index = 0;
    local_90 = (uint8_t *)data1v;
    local_68 = size2;
    do {
      lVar2 = 0;
      uVar8 = 0;
      do {
        uVar3 = 0xffff;
        uVar5 = 0xffff;
        if ((ulong)(lVar7 + lVar2) < size1) {
          uVar5 = (uint)*(byte *)((long)data1v + lVar2);
        }
        if ((ulong)(lVar7 + lVar2) < size2) {
          uVar3 = (uint)*(byte *)((long)data2v + lVar2);
        }
        uVar6 = 1 << ((byte)lVar2 & 0x1f);
        if (uVar5 == uVar3) {
          uVar6 = 0;
        }
        uVar8 = uVar8 | uVar6;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x10);
      diff_flags = (uint16_t)uVar8;
      local_98 = line_index;
      if (diff_flags == 0) {
        if ((long)line_index <= (long)(context_lines + sVar4)) {
          local_88 = data2v;
          print_binary_diff::anon_class_32_4_ace858be::operator()
                    (&local_50,' ',local_90,size1,line_index,0,NORMAL);
          uVar1 = local_98 + 1;
          data2v = local_88;
        }
      }
      else {
        local_88 = data2v;
        local_58 = data1v;
        if (uVar1 + context_lines < line_index) {
          fwrite("  ...\n",6,1,local_80);
          uVar1 = line_index - context_lines;
        }
        data = local_90;
        if (uVar1 < local_98) {
          do {
            print_binary_diff::anon_class_32_4_ace858be::operator()
                      (&local_50,' ',data,size1,uVar1,0,NORMAL);
            uVar1 = uVar1 + 1;
          } while (uVar1 < local_98);
        }
        uVar1 = local_98 << 4;
        if (uVar1 < size1) {
          print_binary_diff::anon_class_32_4_ace858be::operator()
                    (&local_50,'-',local_90,size1,local_98,diff_flags,FG_RED);
        }
        size2 = local_68;
        if (uVar1 < local_68) {
          print_binary_diff::anon_class_32_4_ace858be::operator()
                    (&local_50,'+',local_78,local_68,local_98,diff_flags,FG_GREEN);
        }
        uVar1 = local_98 + 1;
        sVar4 = local_98;
        data2v = local_88;
        data1v = local_58;
      }
      line_index = local_98 + 1;
      data2v = (void *)((long)data2v + 0x10);
      data1v = (void *)((long)data1v + 0x10);
      lVar7 = lVar7 + 0x10;
    } while (line_index != local_60);
  }
  if (uVar1 < local_70) {
    fwrite("  ...\n",6,1,local_80);
  }
  return;
}

Assistant:

void print_binary_diff(
    FILE* stream,
    const void* data1v,
    size_t size1,
    const void* data2v,
    size_t size2,
    bool use_color,
    size_t context_lines,
    uint64_t base_offset = 0) {
  const uint8_t* data1 = reinterpret_cast<const uint8_t*>(data1v);
  const uint8_t* data2 = reinterpret_cast<const uint8_t*>(data2v);

  size_t max_data_size = std::max<size_t>(size1, size2);
  int offset_width_digits;
  if (base_offset + max_data_size > 0x100000000) {
    offset_width_digits = 16;
  } else if (base_offset + max_data_size > 0x10000) {
    offset_width_digits = 8;
  } else if (base_offset + max_data_size > 0x100) {
    offset_width_digits = 4;
  } else {
    offset_width_digits = 2;
  }

  auto print_diff_line = [&](char left_ch,
                             const uint8_t* data,
                             size_t size,
                             size_t line_index,
                             uint16_t diff_flags,
                             TerminalFormat color) {
    size_t line_start_offset = line_index * 0x10;
    if (use_color) {
      print_color_escape(stream, color, TerminalFormat::END);
    }
    uint64_t address = base_offset + line_start_offset;
    fprintf(stream, "%c %0*" PRIX64 " |", left_ch, offset_width_digits, address);
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fprintf(stream, " %02hhX", data[offset]);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fprintf(stream, " %02hhX", data[offset]);
        }
      } else {
        fprintf(stream, "   ");
      }
    }
    fprintf(stream, " | ");
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        char ch = data[offset];
        if (ch < 0x20 || ch > 0x7E) {
          ch = ' ';
        }
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fputc(ch, stream);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fputc(ch, stream);
        }
      } else {
        fputc(' ', stream);
      }
    }
    if (use_color) {
      print_color_escape(stream, TerminalFormat::NORMAL, TerminalFormat::END);
    }
    fputc('\n', stream);
  };

  auto print_diff_line_pair = [&](size_t line_index, uint16_t diff_flags) -> void {
    size_t line_start_offset = line_index * 0x10;
    if (diff_flags == 0) {
      print_diff_line(' ', data1, size1, line_index, diff_flags, TerminalFormat::NORMAL);
    } else {
      if (line_start_offset < size1) {
        print_diff_line('-', data1, size1, line_index, diff_flags, TerminalFormat::FG_RED);
      }
      if (line_start_offset < size2) {
        print_diff_line('+', data2, size2, line_index, diff_flags, TerminalFormat::FG_GREEN);
      }
    }
  };

  size_t first_unprinted_line_index = 0;
  ssize_t last_different_line_index = -(context_lines + 1);
  size_t num_lines = ((max_data_size + 0x0F) >> 4);
  for (size_t line_index = 0; line_index < num_lines; line_index++) {
    uint16_t diff_flags = 0;
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      uint16_t data1_value = (offset < size1) ? static_cast<uint8_t>(data1[offset]) : 0xFFFF;
      uint16_t data2_value = (offset < size2) ? static_cast<uint8_t>(data2[offset]) : 0xFFFF;
      if (data1_value != data2_value) {
        diff_flags |= (1 << within_line_offset);
      }
    }
    if (diff_flags == 0) {
      if (static_cast<ssize_t>(line_index) <= last_different_line_index + static_cast<ssize_t>(context_lines)) {
        print_diff_line_pair(line_index, diff_flags);
        first_unprinted_line_index = line_index + 1;
      }

    } else {
      bool has_unprinted_gap;
      size_t chunk_start_line_index;
      if ((first_unprinted_line_index + context_lines) >= line_index) {
        chunk_start_line_index = first_unprinted_line_index;
        has_unprinted_gap = false;
      } else {
        chunk_start_line_index = line_index - context_lines;
        has_unprinted_gap = true;
      }

      if (has_unprinted_gap) {
        fprintf(stream, "  ...\n");
      }

      for (size_t z = chunk_start_line_index; z < line_index; z++) {
        print_diff_line_pair(z, 0x0000);
      }
      print_diff_line_pair(line_index, diff_flags);
      first_unprinted_line_index = line_index + 1;
      last_different_line_index = line_index;
    }
  }

  if (first_unprinted_line_index < num_lines) {
    fprintf(stream, "  ...\n");
  }
}